

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

InterpolationType __thiscall
soul::StructuralParser::parseOptionalInterpolationType(StructuralParser *this)

{
  bool bVar1;
  InterpolationType IVar2;
  CompileMessage local_50;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2b016a);
  IVar2 = none;
  if (bVar1) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"none");
    IVar2 = none;
    if (!bVar1) {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"latch");
      IVar2 = latch;
      if (!bVar1) {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"linear");
        IVar2 = linear;
        if (!bVar1) {
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"sinc");
          IVar2 = sinc;
          if (!bVar1) {
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"fast");
            IVar2 = fast;
            if (!bVar1) {
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"best");
              IVar2 = best;
              if (!bVar1) {
                IVar2 = none;
                CompileMessageHelpers::createMessage<>
                          (&local_50,syntax,error,"Expected an interpolation type");
                (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_50);
                CompileMessage::~CompileMessage(&local_50);
              }
            }
          }
        }
      }
    }
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x285ffb);
  }
  return IVar2;
}

Assistant:

InterpolationType parseOptionalInterpolationType()
    {
        if (! matchIf (Operator::openBracket))
            return InterpolationType::none;

        auto type = parseInterpolationType (*this);
        expect (Operator::closeBracket);
        return type;
    }